

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O1

void __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
::reset(evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cfb64>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
        *this)

{
  int iVar1;
  evp_error local_58;
  source_location local_20;
  
  iVar1 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)this->_context,(EVP_CIPHER *)0x0,(ENGINE *)0x0,
                             (uchar *)0x0,(uchar *)0x0);
  if (iVar1 == 1) {
    EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)this->_context,(int)this->_padding);
    this->_total_input = 0;
    this->_total_output = 0;
    return;
  }
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58._32_8_ = 0;
  local_58._40_8_ = 0xffffffff;
  local_58._0_8_ = 0x2e4238;
  local_58._8_8_ = 0x2e4268;
  local_20.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/symmetric/basic_endec.hxx"
  ;
  local_20.function_ =
       "void cryptox::evp_cipher_context<cryptox::symmetric_algorithm<&EVP_bf_cfb64>, &EVP_DecryptInit_ex, &EVP_DecryptUpdate, &EVP_DecryptFinal_ex>::reset() [Algorithm = cryptox::symmetric_algorithm<&EVP_bf_cfb64>, InitFx = &EVP_DecryptInit_ex, UpdateFx = &EVP_DecryptUpdate, FinalFx = &EVP_DecryptFinal_ex]"
  ;
  local_20.line_ = 0x44;
  local_20.column_ = 0;
  boost::throw_exception<cryptox::evp_error>(&local_58,&local_20);
}

Assistant:

void reset() {
			if (InitFx(_context, 0, 0, 0, 0) != 1)
				BOOST_THROW_EXCEPTION(evp_error(/* TODO */));

			padding(_padding);

			_total_input = 0;
			_total_output = 0;
		}